

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

longlong ImGui::RoundScalarWithFormatT<long_long,long_long>
                   (char *format,ImGuiDataType data_type,longlong v)

{
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  double dVar1;
  char *p;
  char v_str [64];
  char *fmt_start;
  char *local_70;
  char local_68 [64];
  char *local_28;
  long local_20;
  int local_14;
  long local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_28 = ImParseFormatFindStart(in_RDI);
  if ((*local_28 == '%') && (local_28[1] != '%')) {
    ImFormatString(local_68,0x40,local_28,local_20);
    for (local_70 = local_68; *local_70 == ' '; local_70 = local_70 + 1) {
    }
    if ((local_14 == 4) || (local_14 == 5)) {
      dVar1 = ImAtof((char *)0x19e1a2);
      local_20 = (long)dVar1;
    }
    else {
      ImAtoi<long_long>(local_70,&local_20);
    }
    local_8 = local_20;
  }
  else {
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}